

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.h
# Opt level: O3

void DrawerCommandQueue::
     QueueCommand<swrenderer::DrawTiltedSpanPalCommand,int&,int&,int&,TVector3<float>const&,TVector3<float>const&,TVector3<float>const&,bool&,int&,float&,int&,int&>
               (int *args,int *args_1,int *args_2,TVector3<float> *args_3,TVector3<float> *args_4,
               TVector3<float> *args_5,bool *args_6,int *args_7,float *args_8,int *args_9,
               int *args_10)

{
  pointer *pppDVar1;
  iterator __position;
  DrawerCommandQueue *this;
  DrawTiltedSpanPalCommand *this_00;
  DrawTiltedSpanPalCommand command;
  
  this = Instance();
  if ((this->threaded_render == 0) || (r_multithreaded.Value == false)) {
    swrenderer::DrawTiltedSpanPalCommand::DrawTiltedSpanPalCommand
              (&command,*args,*args_1,*args_2,args_3,args_4,args_5,*args_6,*args_7,*args_8,*args_9,
               *args_10);
    VectoredTryCatch(&command,QueueCommand<swrenderer::DrawTiltedSpanPalCommand,_int_&,_int_&,_int_&,_const_TVector3<float>_&,_const_TVector3<float>_&,_const_TVector3<float>_&,_bool_&,_int_&,_float_&,_int_&,_int_&>
                              ::anon_class_1_0_00000001::__invoke,
                     QueueCommand<swrenderer::DrawTiltedSpanPalCommand,_int_&,_int_&,_int_&,_const_TVector3<float>_&,_const_TVector3<float>_&,_const_TVector3<float>_&,_bool_&,_int_&,_float_&,_int_&,_int_&>
                     ::anon_class_1_0_00000001::__invoke);
  }
  else {
    this_00 = (DrawTiltedSpanPalCommand *)AllocMemory(0x78);
    if (this_00 == (DrawTiltedSpanPalCommand *)0x0) {
      Finish(this);
      this_00 = (DrawTiltedSpanPalCommand *)AllocMemory(0x78);
      if (this_00 == (DrawTiltedSpanPalCommand *)0x0) {
        return;
      }
    }
    swrenderer::DrawTiltedSpanPalCommand::DrawTiltedSpanPalCommand
              (this_00,*args,*args_1,*args_2,args_3,args_4,args_5,*args_6,*args_7,*args_8,*args_9,
               *args_10);
    __position._M_current =
         (this->commands).super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->commands).super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      command.super_DrawerCommand._vptr_DrawerCommand = (_func_int **)this_00;
      std::vector<DrawerCommand*,std::allocator<DrawerCommand*>>::_M_realloc_insert<DrawerCommand*>
                ((vector<DrawerCommand*,std::allocator<DrawerCommand*>> *)&this->commands,__position
                 ,(DrawerCommand **)&command);
    }
    else {
      *__position._M_current = &this_00->super_DrawerCommand;
      pppDVar1 = &(this->commands).
                  super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppDVar1 = *pppDVar1 + 1;
    }
  }
  return;
}

Assistant:

static void QueueCommand(Types &&... args)
	{
		auto queue = Instance();
		if (queue->threaded_render == 0 || !r_multithreaded)
		{
			T command(std::forward<Types>(args)...);
			VectoredTryCatch(&command,
			[](void *data)
			{
				T *c = (T*)data;
				c->Execute(&Instance()->single_core_thread);
			},
			[](void *data, const char *reason, bool fatal)
			{
				T *c = (T*)data;
				ReportDrawerError(c, false, reason, fatal);
			});
		}
		else
		{
			void *ptr = AllocMemory(sizeof(T));
			if (!ptr) // Out of memory - render what we got
			{
				queue->Finish();
				ptr = AllocMemory(sizeof(T));
				if (!ptr)
					return;
			}
			T *command = new (ptr)T(std::forward<Types>(args)...);
			queue->commands.push_back(command);
		}
	}